

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anonymizer.cpp
# Opt level: O0

void overwrite_data(string *filename,Elf64_Off offset,string *str)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  size_type __n;
  long lVar3;
  fpos<__mbstate_t> local_268;
  allocator<char> local_251;
  string local_250 [8];
  string data;
  long local_220;
  ofstream file;
  string *str_local;
  Elf64_Off offset_local;
  string *filename_local;
  
  _Var2 = std::operator|(_S_in,_S_out);
  _Var2 = std::operator|(_Var2,_S_bin);
  std::ofstream::ofstream(&local_220,(string *)filename,_Var2);
  bVar1 = std::ios::operator!((ios *)((long)&local_220 + *(long *)(local_220 + -0x18)));
  if ((bVar1 & 1) == 0) {
    __n = std::__cxx11::string::length();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_250,__n,'-',&local_251);
    std::allocator<char>::~allocator(&local_251);
    std::fpos<__mbstate_t>::fpos(&local_268,offset);
    std::ostream::seekp(&local_220,local_268._M_off,local_268._M_state);
    lVar3 = std::__cxx11::string::c_str();
    std::__cxx11::string::length();
    std::ostream::write((char *)&local_220,lVar3);
    std::__cxx11::string::~string(local_250);
    std::ofstream::~ofstream(&local_220);
    return;
  }
  __return_storage_ptr__ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       __cxa_allocate_exception(0x20);
  std::operator+(__return_storage_ptr__,"Error opening file",filename);
  __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void overwrite_data( const std::string& filename,
                     Elf64_Off          offset,
                     const std::string& str )
{
    std::ofstream file( filename,
                        std::ios::in | std::ios::out | std::ios::binary );
    if ( !file )
        throw "Error opening file" + filename;
    std::string data( str.length(), '-' );
    file.seekp( (std::streampos)offset );
    file.write( data.c_str(), data.length() + 1 );
}